

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O3

void timer_close_cb(uv_handle_t *timer)

{
  uv_close_cb *ptr;
  uv_handle_t *handle;
  undefined1 *puVar1;
  uv_close_cb p_Var2;
  undefined1 *puVar3;
  
  ptr = &timer[-1].close_cb;
  handle = (uv_handle_t *)timer[-1].close_cb;
  puVar3 = (undefined1 *)handle[1].data;
  if (ptr == (uv_close_cb *)handle[1].data) {
    p_Var2 = timer[0xb].close_cb;
    handle[1].data = p_Var2;
    if ((p_Var2 == (uv_close_cb)0x0) && ((handle->flags & 3) != 0)) {
      uv__make_close_pending(handle);
    }
  }
  else {
    while (puVar1 = *(undefined1 **)(puVar3 + 0x300), (uv_close_cb *)puVar1 != ptr) {
      puVar3 = puVar1;
      if (puVar1 == (undefined1 *)0x0) {
        __assert_fail("last->previous != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                      ,0xfa,"void timer_close_cb(uv_handle_t *)");
      }
    }
    *(uv_close_cb *)(puVar3 + 0x300) = timer[0xb].close_cb;
  }
  uv__free(ptr);
  return;
}

Assistant:

static void timer_close_cb(uv_handle_t* timer) {
  struct poll_ctx* ctx;
  struct poll_ctx* it;
  struct poll_ctx* last;
  uv_fs_poll_t* handle;

  ctx = container_of(timer, struct poll_ctx, timer_handle);
  handle = ctx->parent_handle;
  if (ctx == handle->poll_ctx) {
    handle->poll_ctx = ctx->previous;
    if (handle->poll_ctx == NULL && uv__is_closing(handle))
      uv__make_close_pending((uv_handle_t*)handle);
  } else {
    for (last = handle->poll_ctx, it = last->previous;
         it != ctx;
         last = it, it = it->previous) {
      assert(last->previous != NULL);
    }
    last->previous = ctx->previous;
  }
  uv__free(ctx);
}